

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma2_encoder_options_update(void *coder_ptr,lzma_filter *filter)

{
  void *pvVar1;
  lzma_options_lzma *opt;
  lzma_lzma2_coder_conflict *coder;
  lzma_filter *filter_local;
  void *coder_ptr_local;
  
  if ((filter->options == (void *)0x0) || (*coder_ptr != 0)) {
    coder_ptr_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    pvVar1 = filter->options;
    if (((*(int *)((long)coder_ptr + 0x24) != *(int *)((long)pvVar1 + 0x14)) ||
        (*(int *)((long)coder_ptr + 0x28) != *(int *)((long)pvVar1 + 0x18))) ||
       (*(int *)((long)coder_ptr + 0x2c) != *(int *)((long)pvVar1 + 0x1c))) {
      if (((4 < *(uint *)((long)pvVar1 + 0x14)) || (4 < *(uint *)((long)pvVar1 + 0x18))) ||
         ((4 < (uint)(*(int *)((long)pvVar1 + 0x14) + *(int *)((long)pvVar1 + 0x18)) ||
          (4 < *(uint *)((long)pvVar1 + 0x1c))))) {
        return LZMA_OPTIONS_ERROR;
      }
      *(undefined4 *)((long)coder_ptr + 0x24) = *(undefined4 *)((long)pvVar1 + 0x14);
      *(undefined4 *)((long)coder_ptr + 0x28) = *(undefined4 *)((long)pvVar1 + 0x18);
      *(undefined4 *)((long)coder_ptr + 0x2c) = *(undefined4 *)((long)pvVar1 + 0x1c);
      *(undefined1 *)((long)coder_ptr + 0x80) = 1;
      *(undefined1 *)((long)coder_ptr + 0x81) = 1;
    }
    coder_ptr_local._4_4_ = LZMA_OK;
  }
  return coder_ptr_local._4_4_;
}

Assistant:

static lzma_ret
lzma2_encoder_options_update(void *coder_ptr, const lzma_filter *filter)
{
	lzma_lzma2_coder *coder = coder_ptr;

	// New options can be set only when there is no incomplete chunk.
	// This is the case at the beginning of the raw stream and right
	// after LZMA_SYNC_FLUSH.
	if (filter->options == NULL || coder->sequence != SEQ_INIT)
		return LZMA_PROG_ERROR;

	// Look if there are new options. At least for now,
	// only lc/lp/pb can be changed.
	const lzma_options_lzma *opt = filter->options;
	if (coder->opt_cur.lc != opt->lc || coder->opt_cur.lp != opt->lp
			|| coder->opt_cur.pb != opt->pb) {
		// Validate the options.
		if (opt->lc > LZMA_LCLP_MAX || opt->lp > LZMA_LCLP_MAX
				|| opt->lc + opt->lp > LZMA_LCLP_MAX
				|| opt->pb > LZMA_PB_MAX)
			return LZMA_OPTIONS_ERROR;

		// The new options will be used when the encoder starts
		// a new LZMA2 chunk.
		coder->opt_cur.lc = opt->lc;
		coder->opt_cur.lp = opt->lp;
		coder->opt_cur.pb = opt->pb;
		coder->need_properties = true;
		coder->need_state_reset = true;
	}

	return LZMA_OK;
}